

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O2

uint32_t __thiscall hrgls::datablob::DataBlob::Size(DataBlob *this)

{
  hrgls_DataBlob phVar1;
  uint32_t uVar2;
  hrgls_Status hVar3;
  
  phVar1 = this->m_private->blob;
  if (phVar1 == (hrgls_DataBlob)0x0) {
    uVar2 = 0;
    hVar3 = 0x3ee;
  }
  else {
    uVar2 = phVar1->size;
    hVar3 = 0;
  }
  this->m_private->status = hVar3;
  return uVar2;
}

Assistant:

uint32_t DataBlob::Size() const
    {
      uint32_t ret = 0;
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      const uint8_t *data;
      m_private->status = hrgls_DataBlobGetData(m_private->blob, &data, &ret);
      return ret;
    }